

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O0

void __thiscall argo::unparser::unparse(unparser *this,json *j,int indent_level)

{
  bool bVar1;
  int i;
  type tVar2;
  string *psVar3;
  char *pcVar4;
  type s;
  json_exception *this_00;
  writer *pwVar5;
  double d;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  int local_1c;
  json *pjStack_18;
  int indent_level_local;
  json *j_local;
  unparser *this_local;
  
  local_1c = indent_level;
  pjStack_18 = j;
  j_local = (json *)this;
  psVar3 = json::get_raw_value_abi_cxx11_(j);
  bVar1 = std::operator==(psVar3,"");
  if (bVar1) {
    tVar2 = json::get_instance_type(pjStack_18);
    switch(tVar2) {
    case object_e:
      unparse_object(this,pjStack_18,local_1c);
      break;
    case array_e:
      unparse_array(this,pjStack_18,local_1c);
      break;
    case boolean_e:
      pwVar5 = this->m_writer;
      bVar1 = json::operator_cast_to_bool(pjStack_18);
      pcVar4 = "false";
      if (bVar1) {
        pcVar4 = "true";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar4,&local_41);
      argo::operator<<(pwVar5,(string *)local_40);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      break;
    case null_e:
      pwVar5 = this->m_writer;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"null",&local_79);
      argo::operator<<(pwVar5,(string *)local_78);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      break;
    case number_int_e:
      pwVar5 = this->m_writer;
      i = json::operator_cast_to_int(pjStack_18);
      argo::operator<<(pwVar5,i);
      break;
    case number_double_e:
      pwVar5 = this->m_writer;
      d = json::operator_cast_to_double(pjStack_18);
      argo::operator<<(pwVar5,d);
      break;
    case string_e:
      pwVar5 = argo::operator<<(this->m_writer,'\"');
      psVar3 = json::operator_cast_to_string_(pjStack_18);
      utf8::utf8_to_json_string((utf8 *)&local_88,psVar3);
      s = std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator*(&local_88);
      pwVar5 = argo::operator<<(pwVar5,s);
      argo::operator<<(pwVar5,'\"');
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&local_88);
      break;
    default:
      this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
      json_exception::json_exception(this_00,invalid_json_type_e);
      __cxa_throw(this_00,&json_exception::typeinfo,json_exception::~json_exception);
    }
  }
  else {
    tVar2 = json::get_instance_type(pjStack_18);
    if (tVar2 == string_e) {
      pwVar5 = argo::operator<<(this->m_writer,'\"');
      psVar3 = json::get_raw_value_abi_cxx11_(pjStack_18);
      pwVar5 = argo::operator<<(pwVar5,psVar3);
      argo::operator<<(pwVar5,'\"');
    }
    else {
      pwVar5 = this->m_writer;
      psVar3 = json::get_raw_value_abi_cxx11_(pjStack_18);
      argo::operator<<(pwVar5,psVar3);
    }
  }
  return;
}

Assistant:

void unparser::unparse(const json &j, int indent_level)
{
    if (j.get_raw_value() == "")
    {
        switch (j.get_instance_type())
        {
        case json::object_e:
            unparse_object(j, indent_level);
            break;
        case json::array_e:
            unparse_array(j, indent_level);
            break;
        case json::boolean_e:
            m_writer << (static_cast<bool>(j) ? "true" : "false");
            break;
        case json::null_e:
            m_writer << "null";
            break;
        case json::number_int_e:
            m_writer << static_cast<int>(j);
            break;
        case json::number_double_e:
            m_writer << static_cast<double>(j);
            break;
        case json::string_e:
            m_writer << '"' << *(utf8::utf8_to_json_string(j)) << '"';
            break;
        default:
            throw json_exception(json_exception::invalid_json_type_e);
        }
    }
    else
    {
        if (j.get_instance_type() == json::string_e)
        {
            m_writer << '"' << j.get_raw_value() << '"';
        }
        else
        {
            m_writer << j.get_raw_value();
        }
    }
}